

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  FILE *local_28;
  FILE *local_20;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  if (h264_dbgfile == (FILE *)0x0) {
    local_20 = _stdout;
  }
  else {
    local_20 = (FILE *)h264_dbgfile;
  }
  fprintf(local_20,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u(b,3);
  h->aud->primary_pic_type = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = (FILE *)h264_dbgfile;
  }
  fprintf(local_28,"h->aud->primary_pic_type: %d \n",(ulong)(uint)h->aud->primary_pic_type);
  return;
}

Assistant:

void read_debug_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); h->aud->primary_pic_type = bs_read_u(b, 3); printf("h->aud->primary_pic_type: %d \n", h->aud->primary_pic_type); 
}